

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

bool __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::
isGeometryModified(BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this,
                  size_t objectID)

{
  Geometry *pGVar1;
  
  pGVar1 = (this->scene->geometries).items[objectID].ptr;
  if (pGVar1 != (Geometry *)0x0) {
    return (this->scene->geometryModCounters_).items[objectID] < pGVar1->modCounter_;
  }
  return false;
}

Assistant:

bool  isGeometryModified (size_t objectID) {
        return this->scene->isGeometryModified(objectID);
      }